

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateData::define
          (StateData *this,Box *p_domain,BoxArray *grds,DistributionMapping *dm,StateDescriptor *d,
          Real time,Real dt,FabFactory<amrex::FArrayBox> *factory)

{
  TimeCenter TVar1;
  MFInfo *pMVar2;
  byte bVar3;
  undefined8 *in_RSI;
  DistributionMapping *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  long *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  int ncomp;
  TimeCenter t_typ;
  IndexType typ;
  int off;
  uint bitval;
  uint typ_1;
  int dir;
  BoxArray *in_stack_fffffffffffffe58;
  BoxArray *in_stack_fffffffffffffe60;
  BoxArray *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  IndexType typ_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe90;
  DistributionMapping *in_stack_fffffffffffffe98;
  BoxArray *in_stack_fffffffffffffea8;
  FabFactory<amrex::FArrayBox> *__args_5;
  uint local_f4;
  long *local_f0;
  double local_e8;
  element_type *local_e0;
  uint *local_b0;
  int local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  DistributionMapping *local_98;
  uint local_90;
  int local_8c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_88;
  int local_7c;
  uint *local_78;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  uint local_60;
  int local_5c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_58;
  int local_4c;
  uint *local_48;
  int local_3c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  int local_2c;
  int local_28;
  int local_24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_20;
  int local_18;
  int local_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_10;
  int local_4;
  
  typ_00.itype = (uint)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_e0 = (element_type *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  in_RDI[1].m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)*in_RSI;
  in_RDI[1].m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  in_RDI[2].m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)in_RSI[2];
  *(undefined4 *)
   &in_RDI[2].m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = *(undefined4 *)(in_RSI + 3);
  (in_RDI->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_R8;
  in_RDI[0xd].m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0 = in_R9;
  local_e8 = in_XMM1_Qa;
  BoxArray::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  DistributionMapping::operator=
            ((DistributionMapping *)in_stack_fffffffffffffe60,
             (DistributionMapping *)in_stack_fffffffffffffe58);
  (**(code **)(*local_f0 + 0x28))();
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ::reset((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           *)in_stack_fffffffffffffe60,(pointer)in_stack_fffffffffffffe58);
  local_f4 = (uint)StateDescriptor::getType
                             ((StateDescriptor *)
                              (in_RDI->m_ref).
                              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
  TVar1 = StateDescriptor::timeType
                    ((StateDescriptor *)
                     (in_RDI->m_ref).
                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
  local_b0 = &local_f4;
  if (local_f4 != 0) {
    in_stack_fffffffffffffe98 = in_RDI + 1;
    local_90 = local_f4;
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      local_78 = &local_90;
      local_7c = local_9c;
      local_4c = local_9c;
      local_28 = local_9c;
      bVar3 = (byte)local_9c;
      local_a0 = (uint)((local_f4 & 1 << (bVar3 & 0x1f)) != 0);
      local_88 = &in_RDI[2].m_ref.
                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
      local_8c = local_9c;
      local_3c = local_9c;
      local_2c = local_9c;
      local_a4 = (uint)((*(uint *)&local_88->_M_pi & 1 << (bVar3 & 0x1f)) != 0);
      local_a8 = local_a0 - local_a4;
      local_68 = (undefined1 *)
                 ((long)&in_RDI[1].m_ref.
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 4);
      local_6c = local_9c;
      *(int *)(local_68 + (long)local_9c * 4) = local_a8 + *(int *)(local_68 + (long)local_9c * 4);
      in_stack_fffffffffffffe90 =
           &in_RDI[2].m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      local_5c = local_9c;
      if (local_a0 == 0) {
        local_24 = local_9c;
        local_18 = local_9c;
        *(uint *)&in_stack_fffffffffffffe90->_M_pi =
             (1 << (bVar3 & 0x1f) ^ 0xffffffffU) & *(uint *)&in_stack_fffffffffffffe90->_M_pi;
        local_20 = in_stack_fffffffffffffe90;
      }
      else {
        local_14 = local_9c;
        local_4 = local_9c;
        *(uint *)&in_stack_fffffffffffffe90->_M_pi =
             1 << (bVar3 & 0x1f) | *(uint *)&in_stack_fffffffffffffe90->_M_pi;
        local_10 = in_stack_fffffffffffffe90;
      }
      local_70 = local_a8;
      local_60 = local_a0;
      local_58 = in_stack_fffffffffffffe90;
      local_48 = local_78;
      local_38 = local_88;
    }
    local_98 = in_stack_fffffffffffffe98;
    BoxArray::convert(in_stack_fffffffffffffe68,typ_00);
  }
  if (TVar1 == Point) {
    in_RDI[0xb].m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_e0;
    in_RDI[10].m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0;
    in_RDI[0xc].m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((double)local_e0 - local_e8);
    in_RDI[0xb].m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((double)local_e0 - local_e8);
  }
  else {
    in_RDI[10].m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0;
    in_RDI[0xb].m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((double)local_e0 + local_e8);
    in_RDI[0xb].m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((double)local_e0 - local_e8);
    in_RDI[0xc].m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_e0;
  }
  StateDescriptor::nComp
            ((StateDescriptor *)
             (in_RDI->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  StateDescriptor::nExtra
            ((StateDescriptor *)
             (in_RDI->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  __args_5 = (FabFactory<amrex::FArrayBox> *)0x0;
  MFInfo::MFInfo((MFInfo *)0x13b26c5);
  pMVar2 = MFInfo::SetTag((MFInfo *)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
  MFInfo::SetArena(pMVar2,(Arena *)in_RDI[0xd].m_ref.
                                   super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
  pMVar2 = (MFInfo *)
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffffe60);
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int&,int,amrex::MFInfo&,amrex::FabFactory<amrex::FArrayBox>&>
            (in_stack_fffffffffffffea8,in_RDI,(int *)in_stack_fffffffffffffe98,
             (int *)in_stack_fffffffffffffe90,pMVar2,__args_5);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffffe60,
             (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)pMVar2);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffffe60);
  MFInfo::~MFInfo((MFInfo *)0x13b2769);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffffe60,(pointer)pMVar2);
  return;
}

Assistant:

void
StateData::define (const Box&             p_domain,
                   const BoxArray&        grds,
                   const DistributionMapping& dm,
                   const StateDescriptor& d,
                   Real                   time,
                   Real                   dt,
                   const FabFactory<FArrayBox>& factory)
{
    BL_PROFILE("StateData::define()");
    domain = p_domain;
    desc = &d;
    arena = nullptr;
    grids = grds;
    dmap = dm;
    m_factory.reset(factory.clone());
    //
    // Convert to proper type.
    //
    IndexType typ(desc->getType());
    StateDescriptor::TimeCenter t_typ(desc->timeType());
    if (!typ.cellCentered())
    {
        domain.convert(typ);
        grids.convert(typ);
    }
    if (t_typ == StateDescriptor::Point)
    {
        new_time.start = new_time.stop = time;
        old_time.start = old_time.stop = time - dt;
    }
    else
    {
        new_time.start = time;
        new_time.stop  = time+dt;
        old_time.start = time-dt;
        old_time.stop  = time;
    }
    int ncomp = desc->nComp();

    new_data = std::make_unique<MultiFab>(grids,dmap,ncomp,desc->nExtra(),
                                          MFInfo().SetTag("StateData").SetArena(arena),
                                          *m_factory);
    old_data.reset();
}